

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderErrors.cpp
# Opt level: O3

string * __thiscall
glcts::TessellationShaderError7::getTessellationControlShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderError7 *this,uint n_program_object)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices=4) out;\n\nout vec4 test[];\n\nvoid main()\n{\n    gl_out[2].gl_Position = gl_in[0].gl_Position;\n    test[2]               = gl_in[1].gl_Position;\n}\n"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderError7::getTessellationControlShaderCode(unsigned int n_program_object)
{
	DE_UNREF(n_program_object);

	return "${VERSION}\n"
		   "\n"
		   "${TESSELLATION_SHADER_REQUIRE}\n"
		   "\n"
		   "layout (vertices=4) out;\n"
		   "\n"
		   "out vec4 test[];\n"
		   "\n"
		   "void main()\n"
		   "{\n"
		   "    gl_out[2].gl_Position = gl_in[0].gl_Position;\n"
		   "    test[2]               = gl_in[1].gl_Position;\n"
		   "}\n";
}